

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.cpp
# Opt level: O2

int luaD_pcall(lua_State *L,Pfunc func,void *u,ptrdiff_t old_top,ptrdiff_t ef)

{
  lu_byte lVar1;
  unsigned_short uVar2;
  CallInfo *pCVar3;
  ptrdiff_t pVar4;
  int errcode;
  StkId level;
  
  pCVar3 = L->ci;
  lVar1 = L->allowhook;
  uVar2 = L->nny;
  pVar4 = L->errfunc;
  L->errfunc = ef;
  errcode = luaD_rawrunprotected(L,func,u);
  if (errcode != 0) {
    level = (StkId)((long)&L->stack->value_ + old_top);
    luaF_close(L,level);
    seterrorobj(L,errcode,level);
    L->ci = pCVar3;
    L->allowhook = lVar1;
    L->nny = uVar2;
    luaD_shrinkstack(L);
  }
  L->errfunc = pVar4;
  return errcode;
}

Assistant:

int luaD_pcall (lua_State *L, Pfunc func, void *u,
                ptrdiff_t old_top, ptrdiff_t ef) {
  int status;
  CallInfo *old_ci = L->ci;
  lu_byte old_allowhooks = L->allowhook;
  unsigned short old_nny = L->nny;
  ptrdiff_t old_errfunc = L->errfunc;
  L->errfunc = ef;
  status = luaD_rawrunprotected(L, func, u);
  if (status != LUA_OK) {  /* an error occurred? */
    StkId oldtop = restorestack(L, old_top);
    luaF_close(L, oldtop);  /* close possible pending closures */
    seterrorobj(L, status, oldtop);
    L->ci = old_ci;
    L->allowhook = old_allowhooks;
    L->nny = old_nny;
    luaD_shrinkstack(L);
  }
  L->errfunc = old_errfunc;
  return status;
}